

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

bool __thiscall
cmFindLibraryHelper::CheckDirectoryForName(cmFindLibraryHelper *this,string *path,Name *name)

{
  string *in_relative;
  size_type sVar1;
  cmFindLibraryHelper *pcVar2;
  bool bVar3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar4;
  size_type sVar5;
  size_type sVar6;
  _Base_ptr p_Var7;
  uint minor;
  uint major;
  uint local_b0;
  uint local_ac;
  size_type local_a8;
  size_type local_a0;
  RegularExpression *local_98;
  string *local_90;
  cmFindLibraryHelper *local_88;
  string *local_80;
  string *local_78;
  string local_70;
  string dir;
  
  if (name->TryRaw == true) {
    in_relative = &this->TestPath;
    std::__cxx11::string::_M_assign((string *)in_relative);
    std::__cxx11::string::append((string *)in_relative);
    bVar3 = cmsys::SystemTools::FileExists((this->TestPath)._M_dataplus._M_p,true);
    if (bVar3) {
      cmsys::SystemTools::CollapseFullPath(&dir,in_relative);
      std::__cxx11::string::operator=((string *)&this->BestPath,(string *)&dir);
      std::__cxx11::string::~string((string *)&dir);
      cmsys::SystemTools::ConvertToUnixSlashes(&this->BestPath);
      return true;
    }
  }
  local_a0 = (long)(this->Prefixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Prefixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (long)(this->Suffixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Suffixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&dir,(string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(&dir);
  local_78 = path;
  psVar4 = cmGlobalGenerator::GetDirectoryContent(this->GG,&dir,true);
  local_a0 = (long)local_a0 >> 5;
  local_a8 = (long)local_a8 >> 5;
  p_Var7 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_98 = &name->Regex;
  local_90 = &this->TestPath;
  local_80 = (string *)&this->BestPath;
  local_b0 = 0;
  local_ac = 0;
  local_88 = this;
  for (; (_Rb_tree_header *)p_Var7 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    bVar3 = cmsys::RegularExpression::find(local_98,(string *)(p_Var7 + 1));
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)local_90);
      std::__cxx11::string::append((string *)local_90);
      bVar3 = cmsys::SystemTools::FileIsDirectory(local_90);
      if (!bVar3) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_70,local_98,1);
        sVar5 = GetPrefixIndex(this,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        cmsys::RegularExpression::match_abi_cxx11_(&local_70,local_98,2);
        pcVar2 = local_88;
        sVar6 = GetSuffixIndex(local_88,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        major = 0;
        minor = 0;
        if (pcVar2->OpenBSD == true) {
          cmsys::RegularExpression::match_abi_cxx11_(&local_70,local_98,3);
          __isoc99_sscanf(local_70._M_dataplus._M_p,".%u.%u",&major,&minor);
          std::__cxx11::string::~string((string *)&local_70);
        }
        if (((((local_88->BestPath)._M_string_length == 0) || (sVar5 < local_a0)) ||
            ((sVar5 == local_a0 && (sVar6 < local_a8)))) ||
           (((this = local_88, sVar5 == local_a0 && (sVar6 == local_a8)) &&
            ((local_ac < major || ((major == local_ac && (local_b0 < minor)))))))) {
          std::__cxx11::string::_M_assign(local_80);
          local_ac = major;
          local_b0 = minor;
          this = local_88;
          local_a8 = sVar6;
          local_a0 = sVar5;
        }
      }
    }
  }
  sVar1 = (this->BestPath)._M_string_length;
  std::__cxx11::string::~string((string *)&dir);
  return sVar1 != 0;
}

Assistant:

bool cmFindLibraryHelper::CheckDirectoryForName(std::string const& path,
                                                Name& name)
{
  // If the original library name provided by the user matches one of
  // the suffixes, try it first.  This allows users to search
  // specifically for a static library on some platforms (on MS tools
  // one cannot tell just from the library name whether it is a static
  // library or an import library).
  if (name.TryRaw) {
    this->TestPath = path;
    this->TestPath += name.Raw;
    if (cmSystemTools::FileExists(this->TestPath.c_str(), true)) {
      this->BestPath = cmSystemTools::CollapseFullPath(this->TestPath);
      cmSystemTools::ConvertToUnixSlashes(this->BestPath);
      return true;
    }
  }

  // No library file has yet been found.
  size_type bestPrefix = this->Prefixes.size();
  size_type bestSuffix = this->Suffixes.size();
  unsigned int bestMajor = 0;
  unsigned int bestMinor = 0;

  // Search for a file matching the library name regex.
  std::string dir = path;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::set<std::string> const& files = this->GG->GetDirectoryContent(dir);
  for (std::set<std::string>::const_iterator fi = files.begin();
       fi != files.end(); ++fi) {
    std::string const& origName = *fi;
#if defined(_WIN32) || defined(__APPLE__)
    std::string testName = cmSystemTools::LowerCase(origName);
#else
    std::string const& testName = origName;
#endif
    if (name.Regex.find(testName)) {
      this->TestPath = path;
      this->TestPath += origName;
      if (!cmSystemTools::FileIsDirectory(this->TestPath)) {
        // This is a matching file.  Check if it is better than the
        // best name found so far.  Earlier prefixes are preferred,
        // followed by earlier suffixes.  For OpenBSD, shared library
        // version extensions are compared.
        size_type prefix = this->GetPrefixIndex(name.Regex.match(1));
        size_type suffix = this->GetSuffixIndex(name.Regex.match(2));
        unsigned int major = 0;
        unsigned int minor = 0;
        if (this->OpenBSD) {
          sscanf(name.Regex.match(3).c_str(), ".%u.%u", &major, &minor);
        }
        if (this->BestPath.empty() || prefix < bestPrefix ||
            (prefix == bestPrefix && suffix < bestSuffix) ||
            (prefix == bestPrefix && suffix == bestSuffix &&
             (major > bestMajor ||
              (major == bestMajor && minor > bestMinor)))) {
          this->BestPath = this->TestPath;
          bestPrefix = prefix;
          bestSuffix = suffix;
          bestMajor = major;
          bestMinor = minor;
        }
      }
    }
  }

  // Use the best candidate found in this directory, if any.
  return !this->BestPath.empty();
}